

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::ClassSpecifierSyntax>
          (DeepCloneVisitor *this,ClassSpecifierSyntax *node,BumpAllocator *alloc)

{
  ClassSpecifierSyntax *pCVar1;
  Token local_38;
  Token local_28;
  
  local_28 = parsing::Token::deepClone(&node->colon,alloc);
  local_38 = parsing::Token::deepClone(&node->keyword,alloc);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClassSpecifierSyntax,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_28,&local_38);
  return &pCVar1->super_SyntaxNode;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }